

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::yml::Tree::is_root(Tree *this,size_t node)

{
  bool bVar1;
  error_flags eVar2;
  NodeData *pNVar3;
  Tree *in_RSI;
  Location in_stack_00000000;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  Location *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffe8;
  
  pNVar3 = _p(in_RSI,in_stack_ffffffffffffffe8);
  if ((pNVar3->m_parent == 0xffffffffffffffff) && (in_RSI != (Tree *)0x0)) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
                       ,in_stack_ffffffffffffff98);
    error<54ul>((char (*) [54])in_RSI,in_stack_00000000);
  }
  pNVar3 = _p(in_RSI,in_stack_ffffffffffffffe8);
  return pNVar3->m_parent == 0xffffffffffffffff;
}

Assistant:

bool has_parent(size_t node) const { return _p(node)->m_parent != NONE; }